

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

int ascii_strncasecmp(char *LHS,char *RHS,size_t Length)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  
  if (Length != 0) {
    sVar2 = 0;
    do {
      bVar1 = LHS[sVar2];
      bVar3 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar3 = bVar1;
      }
      bVar1 = RHS[sVar2];
      bVar4 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar4 = bVar1;
      }
      if (bVar3 != bVar4) {
        return -(uint)(bVar3 < bVar4) | 1;
      }
      sVar2 = sVar2 + 1;
    } while (Length != sVar2);
  }
  return 0;
}

Assistant:

static int ascii_strncasecmp(const char *LHS, const char *RHS, size_t Length) {
  for (size_t I = 0; I < Length; ++I) {
    unsigned char LHC = toLower(LHS[I]);
    unsigned char RHC = toLower(RHS[I]);
    if (LHC != RHC)
      return LHC < RHC ? -1 : 1;
  }
  return 0;
}